

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

void __thiscall ScapeGoatTree::caseB(ScapeGoatTree *this,Node *par,Node *loc)

{
  Node *pNVar1;
  
  pNVar1 = loc->leftChild;
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = loc->rightChild;
  }
  if ((par != (Node *)0x0) && (this = (ScapeGoatTree *)&par->leftChild, par->leftChild != loc)) {
    this = (ScapeGoatTree *)par;
  }
  ((Node *)this)->rightChild = pNVar1;
  return;
}

Assistant:

void ScapeGoatTree::caseB(Node *par, Node *loc) {
    Node *child;
    if (loc->leftChild != nullptr) {
        child = loc->leftChild;
    } else {
        child = loc->rightChild;
    }
    if (par == nullptr) {
        root = child;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = child;
        } else {
            par->rightChild = child;
        }
    }
}